

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O1

void __thiscall cppcms::widgets::select_base::selected_id(select_base *this,string *id)

{
  size_t __n;
  pointer peVar1;
  int iVar2;
  long lVar3;
  runtime_error *this_00;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __n = id->_M_string_length;
  if (__n == 0) {
    this->selected_ = -1;
    this->default_selected_ = -1;
    return;
  }
  peVar1 = (this->elements_).
           super__Vector_base<cppcms::widgets::select_base::element,_std::allocator<cppcms::widgets::select_base::element>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->elements_).
                super__Vector_base<cppcms::widgets::select_base::element,_std::allocator<cppcms::widgets::select_base::element>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)peVar1;
  bVar7 = lVar3 != 0;
  if (bVar7) {
    uVar6 = (lVar3 >> 4) * 0x4ec4ec4ec4ec4ec5;
    uVar5 = 0;
    do {
      iVar4 = (int)uVar5;
      if ((__n == peVar1[uVar5].id._M_string_length) &&
         (iVar2 = bcmp((id->_M_dataplus)._M_p,peVar1[uVar5].id._M_dataplus._M_p,__n), iVar2 == 0)) {
        this->selected_ = iVar4;
        this->default_selected_ = iVar4;
        if (bVar7) {
          return;
        }
        break;
      }
      uVar5 = (ulong)(iVar4 + 1);
      bVar8 = uVar6 - uVar5 != 0;
      bVar7 = uVar5 <= uVar6 && bVar8;
    } while (uVar5 <= uVar6 && bVar8);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
  std::operator+(&local_50,"Select base::invalid index: ",id);
  booster::runtime_error::runtime_error(this_00,&local_50);
  *(undefined ***)this_00 = &PTR__runtime_error_00287810;
  (this_00->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00287838;
  __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

select_multiple::~select_multiple()
{
}